

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O1

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::QuadRegion::handle
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          QuadRegion *this,Vector3d *position)

{
  undefined1 auVar1 [16];
  bool bVar2;
  Index size;
  double *pdVar3;
  CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_Eigen::internal::SingleRange>_>
  *pCVar4;
  undefined8 *puVar5;
  long lVar6;
  char *__function;
  ulong uVar7;
  ActualDstType actualDst;
  Matrix3d *pMVar8;
  ulong uVar9;
  QuadRegion *pQVar10;
  byte bVar11;
  Scalar SVar12;
  double dVar13;
  undefined1 auVar14 [16];
  optional<double> oVar15;
  optional<double> oVar16;
  VectorXd pvs;
  Matrix<double,__1,_1,_0,__1,_1> local_188;
  double local_178;
  double local_170;
  undefined1 local_168 [16];
  void *local_158;
  long local_150;
  Vector3d *local_148;
  double *local_140;
  double local_138;
  type local_130;
  double local_110;
  double local_108;
  double local_100;
  Vector3d local_f8;
  Vector3d local_d8;
  undefined1 local_c0 [144];
  
  bVar11 = 0;
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2];
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1];
  pMVar8 = &this->_polyBasisX;
  pQVar10 = (QuadRegion *)(local_c0 + 0x48);
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pQVar10->super_RegionHandler)._vptr_RegionHandler =
         (_func_int **)
         (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[0];
    pMVar8 = (Matrix3d *)
             ((pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array + 1);
    pQVar10 = (QuadRegion *)&(pQVar10->super_RegionHandler)._outputChannels;
  }
  oVar15 = _pan(pQVar10,&local_d8,(Matrix3d *)(local_c0 + 0x48));
  local_178 = oVar15.super_type.m_storage;
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2];
  pMVar8 = &this->_polyBasisY;
  pQVar10 = (QuadRegion *)local_c0;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pQVar10->super_RegionHandler)._vptr_RegionHandler =
         (_func_int **)
         (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[0];
    pMVar8 = (Matrix3d *)((long)pMVar8 + (ulong)bVar11 * -0x10 + 8);
    pQVar10 = (QuadRegion *)((long)pQVar10 + (ulong)bVar11 * -0x10 + 8);
  }
  oVar16 = _pan(pQVar10,&local_f8,(Matrix3d *)local_c0);
  local_170 = oVar16.super_type.m_storage;
  if ((((undefined1  [16])oVar15.super_type & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
     (((undefined1  [16])oVar16.super_type & (undefined1  [16])0x1) == (undefined1  [16])0x0)) {
    (__return_storage_ptr__->super_type).m_initialized = false;
    return __return_storage_ptr__;
  }
  local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  free((void *)0x0);
  pdVar3 = (double *)malloc(0x20);
  if (((ulong)pdVar3 & 0xf) != 0) {
    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/Memory.h"
                  ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
  }
  if (pdVar3 != (double *)0x0) {
    local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 4;
    pdVar3[2] = 0.0;
    pdVar3[3] = 0.0;
    *pdVar3 = 0.0;
    pdVar3[1] = 0.0;
    local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar3;
    Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator()
              (&local_130,(DenseBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_188,&this->_order);
    if ((((undefined1  [16])oVar15.super_type & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       (((undefined1  [16])oVar16.super_type & (undefined1  [16])0x1) == (undefined1  [16])0x0)) {
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bc,
                    "reference_type boost::optional<double>::get() [T = double]");
    }
    local_168._8_8_ = (double *)0x0;
    local_158 = (void *)0x1;
    local_150 = 1;
    local_168._0_8_ = &local_130;
    if (local_130.m_rowIndices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage
        .m_rows < 1) {
      __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                    ,0x25,
                    "Eigen::CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double, -1, 1>, Eigen::Matrix<int, -1, 1>, Eigen::internal::SingleRange>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::IndexedView<Eigen::Matrix<double, -1, 1>, Eigen::Matrix<int, -1, 1>, Eigen::internal::SingleRange>]"
                   );
    }
    local_110 = 1.0 - local_178;
    ((local_130.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
    m_data[*local_130.m_rowIndices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
            m_storage.m_data] = local_110 * (1.0 - local_170);
    local_140 = (double *)((1.0 - local_170) * local_178);
    pCVar4 = Eigen::
             CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::internal::SingleRange>_>
             ::operator_((CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_Eigen::internal::SingleRange>_>
                          *)local_168,(Scalar *)&local_140);
    local_100 = local_178 * local_170;
    pCVar4 = Eigen::
             CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::internal::SingleRange>_>
             ::operator_(pCVar4,&local_100);
    local_108 = local_110 * local_170;
    Eigen::
    CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::internal::SingleRange>_>
    ::operator_(pCVar4,&local_108);
    if ((local_150 + local_168._8_8_ ==
         (((Matrix<int,__1,_1,_0,__1,_1> *)(local_168._0_8_ + 8))->
         super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows) &&
       (local_158 == (void *)0x1)) {
      free(local_130.m_rowIndices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          == (this->super_RegionHandler)._positions.
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) {
        if ((this->super_RegionHandler)._positions.
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols == 3)
        {
          local_130.m_rowIndices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
          m_storage.m_data = (int *)&(this->super_RegionHandler)._positions;
          local_140 = &local_138;
          local_130.m_xpr = &local_188;
          local_130.m_rowIndices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows = (Index)position;
          Eigen::internal::
          product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                               *)(local_168 + 8),(XprType *)&local_130);
          local_148 = (Vector3d *)
                      local_130.m_rowIndices.
                      super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
          local_178 = *(double *)(local_168._8_8_ + 0x10) *
                      (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       local_130.m_rowIndices.
                       super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
                      ->m_storage).m_data.array[2] +
                      (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       local_130.m_rowIndices.
                       super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
                      ->m_storage).m_data.array[1] * *(double *)(local_168._8_8_ + 8) +
                      (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       local_130.m_rowIndices.
                       super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
                      ->m_storage).m_data.array[0] * *(double *)local_168._8_8_;
          free(local_158);
          local_138 = local_178;
          SVar12 = 0.0;
          if (*local_140 <= 0.0) {
            bVar2 = false;
          }
          else {
            local_130.m_xpr = &local_188;
            if (local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows != 0) {
              if (local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                  .m_rows < 1) {
                local_130.m_xpr = &local_188;
                __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Redux.h"
                              ,0x19b,
                              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                             );
              }
              local_168._8_8_ =
                   local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
              local_130.m_xpr = &local_188;
              SVar12 = Eigen::internal::
                       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                       ::
                       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   *)local_168,(scalar_sum_op<double,_double> *)&local_140,
                                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                   *)&local_130);
            }
            if (local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows < 0) {
              __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                            ,0x4a,
                            "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                           );
            }
            auVar14._8_8_ = 0;
            auVar14._0_8_ = SVar12;
            auVar14 = sqrtpd(auVar14,auVar14);
            uVar7 = local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows & 0x7ffffffffffffffe;
            dVar13 = auVar14._0_8_;
            if (1 < local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows) {
              uVar9 = 0;
              do {
                auVar1._8_8_ = dVar13;
                auVar1._0_8_ = dVar13;
                auVar14 = divpd(*(undefined1 (*) [16])
                                 (local_188.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data + uVar9),auVar1);
                *(undefined1 (*) [16])
                 (local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                  .m_data + uVar9) = auVar14;
                uVar9 = uVar9 + 2;
              } while (uVar9 < uVar7);
            }
            if ((long)uVar7 <
                local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) {
              do {
                local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data[uVar7] =
                     local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data[uVar7] / dVar13;
                uVar7 = uVar7 + 1;
              } while (local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows != uVar7);
            }
            (__return_storage_ptr__->super_type).m_initialized = false;
            *(double **)&(__return_storage_ptr__->super_type).m_storage.dummy_ =
                 local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
            *(Index *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 8) =
                 local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows;
            local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data = (double *)0x0;
            local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows = 0;
            bVar2 = true;
          }
          (__return_storage_ptr__->super_type).m_initialized = bVar2;
          free(local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
          return __return_storage_ptr__;
        }
        __function = 
        "Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, 3, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, 3, 1>, Option = 0]"
        ;
      }
      else {
        __function = 
        "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
        ;
      }
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Product.h"
                    ,0x62,__function);
    }
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                  ,0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double, -1, 1>, Eigen::Matrix<int, -1, 1>, Eigen::internal::SingleRange>>::finished() [MatrixType = Eigen::IndexedView<Eigen::Matrix<double, -1, 1>, Eigen::Matrix<int, -1, 1>, Eigen::internal::SingleRange>]"
                 );
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = std::random_device::_M_fini;
  __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

boost::optional<Eigen::VectorXd> QuadRegion::handle(
      Eigen::Vector3d position) const {
    boost::optional<double> x = _pan(position, _polyBasisX);
    boost::optional<double> y = _pan(position, _polyBasisY);

    if (x == boost::none || y == boost::none) {
      return boost::none;
    }

    Eigen::VectorXd pvs = Eigen::Vector4d::Zero();
    pvs(_order) << (1 - x.get()) * (1 - y.get()), x.get() * (1 - y.get()),
        x.get() * y.get(), (1 - x.get()) * y.get();
    if ((pvs.transpose() * _positions) * position <= 0) {
      return boost::none;
    }
    pvs /= pvs.norm();
    return pvs;
  }